

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::JsonUnitTestResultPrinter::OutputJsonTestInfo
               (ostream *stream,char *test_suite_name,TestInfo *test_info)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  ostream *poVar4;
  char *pcVar5;
  internal *piVar6;
  TestPartResult *this;
  size_t width;
  size_t width_00;
  size_t width_01;
  TimeInMillis ms;
  TimeInMillis ms_00;
  size_t width_02;
  char *local_4e8;
  string local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  undefined1 local_410 [8];
  string message;
  string location;
  TestPartResult *part;
  int i;
  int failures;
  allocator local_399;
  string local_398;
  allocator local_371;
  string local_370;
  string local_350;
  allocator local_329;
  string local_328;
  string local_308;
  allocator local_2e1;
  string local_2e0;
  allocator local_2b9;
  string local_2b8;
  allocator local_291;
  string local_290;
  allocator local_269;
  string local_268;
  allocator local_241;
  string local_240;
  undefined4 local_21c;
  string local_218;
  allocator local_1f1;
  string local_1f0;
  allocator local_1c9;
  string local_1c8;
  allocator local_1a1;
  string local_1a0;
  allocator local_179;
  string local_178;
  allocator local_151;
  string local_150;
  allocator local_129;
  string local_128;
  allocator local_101;
  string local_100;
  allocator local_d9;
  string local_d8;
  allocator local_b1;
  string local_b0;
  string local_90;
  undefined1 local_70 [8];
  string kIndent;
  undefined1 local_48 [8];
  string kTestsuite;
  TestResult *result;
  TestInfo *test_info_local;
  char *test_suite_name_local;
  ostream *stream_local;
  
  kTestsuite.field_2._8_8_ = TestInfo::result(test_info);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_48,"testcase",(allocator *)(kIndent.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(kIndent.field_2._M_local_buf + 0xf));
  Indent_abi_cxx11_((string *)local_70,(internal *)0xa,width);
  Indent_abi_cxx11_(&local_90,(internal *)0x8,width_00);
  poVar4 = std::operator<<(stream,(string *)&local_90);
  std::operator<<(poVar4,"{\n");
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b0,"name",&local_b1);
  pcVar5 = TestInfo::name(test_info);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d8,pcVar5,&local_d9);
  OutputJsonKey(stream,(string *)local_48,&local_b0,&local_d8,(string *)local_70,true);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  pcVar5 = TestInfo::value_param(test_info);
  if (pcVar5 != (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_100,"value_param",&local_101);
    pcVar5 = TestInfo::value_param(test_info);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_128,pcVar5,&local_129);
    OutputJsonKey(stream,(string *)local_48,&local_100,&local_128,(string *)local_70,true);
    std::__cxx11::string::~string((string *)&local_128);
    std::allocator<char>::~allocator((allocator<char> *)&local_129);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
  }
  pcVar5 = TestInfo::type_param(test_info);
  if (pcVar5 != (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_150,"type_param",&local_151);
    pcVar5 = TestInfo::type_param(test_info);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_178,pcVar5,&local_179);
    OutputJsonKey(stream,(string *)local_48,&local_150,&local_178,(string *)local_70,true);
    std::__cxx11::string::~string((string *)&local_178);
    std::allocator<char>::~allocator((allocator<char> *)&local_179);
    std::__cxx11::string::~string((string *)&local_150);
    std::allocator<char>::~allocator((allocator<char> *)&local_151);
  }
  if ((FLAGS_gtest_list_tests & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_240,"status",&local_241);
    bVar1 = TestInfo::should_run(test_info);
    pcVar5 = "NOTRUN";
    if (bVar1) {
      pcVar5 = "RUN";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_268,pcVar5,&local_269);
    OutputJsonKey(stream,(string *)local_48,&local_240,&local_268,(string *)local_70,true);
    std::__cxx11::string::~string((string *)&local_268);
    std::allocator<char>::~allocator((allocator<char> *)&local_269);
    std::__cxx11::string::~string((string *)&local_240);
    std::allocator<char>::~allocator((allocator<char> *)&local_241);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_290,"result",&local_291);
    bVar1 = TestInfo::should_run(test_info);
    if (bVar1) {
      bVar1 = TestResult::Skipped((TestResult *)kTestsuite.field_2._8_8_);
      local_4e8 = "COMPLETED";
      if (bVar1) {
        local_4e8 = "SKIPPED";
      }
    }
    else {
      local_4e8 = "SUPPRESSED";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2b8,local_4e8,&local_2b9);
    OutputJsonKey(stream,(string *)local_48,&local_290,&local_2b8,(string *)local_70,true);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
    std::__cxx11::string::~string((string *)&local_290);
    std::allocator<char>::~allocator((allocator<char> *)&local_291);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2e0,"timestamp",&local_2e1);
    piVar6 = (internal *)TestResult::start_timestamp((TestResult *)kTestsuite.field_2._8_8_);
    FormatEpochTimeInMillisAsRFC3339_abi_cxx11_(&local_308,piVar6,ms);
    OutputJsonKey(stream,(string *)local_48,&local_2e0,&local_308,(string *)local_70,true);
    std::__cxx11::string::~string((string *)&local_308);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_328,"time",&local_329);
    piVar6 = (internal *)TestResult::elapsed_time((TestResult *)kTestsuite.field_2._8_8_);
    FormatTimeInMillisAsDuration_abi_cxx11_(&local_350,piVar6,ms_00);
    OutputJsonKey(stream,(string *)local_48,&local_328,&local_350,(string *)local_70,true);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&local_328);
    std::allocator<char>::~allocator((allocator<char> *)&local_329);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_370,"classname",&local_371);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_398,test_suite_name,&local_399);
    OutputJsonKey(stream,(string *)local_48,&local_370,&local_398,(string *)local_70,false);
    std::__cxx11::string::~string((string *)&local_398);
    std::allocator<char>::~allocator((allocator<char> *)&local_399);
    std::__cxx11::string::~string((string *)&local_370);
    std::allocator<char>::~allocator((allocator<char> *)&local_371);
    TestPropertiesAsJson((string *)&i,(TestResult *)kTestsuite.field_2._8_8_,(string *)local_70);
    std::operator<<(stream,(string *)&i);
    std::__cxx11::string::~string((string *)&i);
    part._4_4_ = 0;
    for (part._0_4_ = 0;
        iVar2 = TestResult::total_part_count((TestResult *)kTestsuite.field_2._8_8_),
        (int)part < iVar2; part._0_4_ = (int)part + 1) {
      this = TestResult::GetTestPartResult((TestResult *)kTestsuite.field_2._8_8_,(int)part);
      bVar1 = TestPartResult::failed(this);
      if (bVar1) {
        std::operator<<(stream,",\n");
        part._4_4_ = part._4_4_ + 1;
        if (part._4_4_ == 1) {
          poVar4 = std::operator<<(stream,(string *)local_70);
          poVar4 = std::operator<<(poVar4,"\"");
          poVar4 = std::operator<<(poVar4,"failures");
          std::operator<<(poVar4,"\": [\n");
        }
        piVar6 = (internal *)TestPartResult::file_name(this);
        uVar3 = TestPartResult::line_number(this);
        FormatCompilerIndependentFileLocation_abi_cxx11_
                  ((string *)((long)&message.field_2 + 8),piVar6,(char *)(ulong)uVar3,iVar2);
        std::operator+(&local_450,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&message.field_2 + 8),"\n");
        pcVar5 = TestPartResult::message(this);
        std::operator+(&local_430,&local_450,pcVar5);
        EscapeJson((string *)local_410,&local_430);
        std::__cxx11::string::~string((string *)&local_430);
        std::__cxx11::string::~string((string *)&local_450);
        poVar4 = std::operator<<(stream,(string *)local_70);
        poVar4 = std::operator<<(poVar4,"  {\n");
        poVar4 = std::operator<<(poVar4,(string *)local_70);
        poVar4 = std::operator<<(poVar4,"    \"failure\": \"");
        poVar4 = std::operator<<(poVar4,(string *)local_410);
        poVar4 = std::operator<<(poVar4,"\",\n");
        poVar4 = std::operator<<(poVar4,(string *)local_70);
        poVar4 = std::operator<<(poVar4,"    \"type\": \"\"\n");
        poVar4 = std::operator<<(poVar4,(string *)local_70);
        std::operator<<(poVar4,"  }");
        std::__cxx11::string::~string((string *)local_410);
        std::__cxx11::string::~string((string *)(message.field_2._M_local_buf + 8));
      }
    }
    if (0 < part._4_4_) {
      poVar4 = std::operator<<(stream,"\n");
      poVar4 = std::operator<<(poVar4,(string *)local_70);
      std::operator<<(poVar4,"]");
    }
    poVar4 = std::operator<<(stream,"\n");
    Indent_abi_cxx11_(&local_470,(internal *)0x8,width_02);
    poVar4 = std::operator<<(poVar4,(string *)&local_470);
    std::operator<<(poVar4,"}");
    std::__cxx11::string::~string((string *)&local_470);
    local_21c = 0;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1a0,"file",&local_1a1);
    pcVar5 = TestInfo::file(test_info);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1c8,pcVar5,&local_1c9);
    OutputJsonKey(stream,(string *)local_48,&local_1a0,&local_1c8,(string *)local_70,true);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1f0,"line",&local_1f1);
    iVar2 = TestInfo::line(test_info);
    OutputJsonKey(stream,(string *)local_48,&local_1f0,iVar2,(string *)local_70,false);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
    poVar4 = std::operator<<(stream,"\n");
    Indent_abi_cxx11_(&local_218,(internal *)0x8,width_01);
    poVar4 = std::operator<<(poVar4,(string *)&local_218);
    std::operator<<(poVar4,"}");
    std::__cxx11::string::~string((string *)&local_218);
    local_21c = 1;
  }
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void JsonUnitTestResultPrinter::OutputJsonTestInfo(::std::ostream* stream,
                                                   const char* test_suite_name,
                                                   const TestInfo& test_info) {
  const TestResult& result = *test_info.result();
  const std::string kTestsuite = "testcase";
  const std::string kIndent = Indent(10);

  *stream << Indent(8) << "{\n";
  OutputJsonKey(stream, kTestsuite, "name", test_info.name(), kIndent);

  if (test_info.value_param() != nullptr) {
    OutputJsonKey(stream, kTestsuite, "value_param", test_info.value_param(),
                  kIndent);
  }
  if (test_info.type_param() != nullptr) {
    OutputJsonKey(stream, kTestsuite, "type_param", test_info.type_param(),
                  kIndent);
  }
  if (GTEST_FLAG(list_tests)) {
    OutputJsonKey(stream, kTestsuite, "file", test_info.file(), kIndent);
    OutputJsonKey(stream, kTestsuite, "line", test_info.line(), kIndent, false);
    *stream << "\n" << Indent(8) << "}";
    return;
  }

  OutputJsonKey(stream, kTestsuite, "status",
                test_info.should_run() ? "RUN" : "NOTRUN", kIndent);
  OutputJsonKey(stream, kTestsuite, "result",
                test_info.should_run()
                    ? (result.Skipped() ? "SKIPPED" : "COMPLETED")
                    : "SUPPRESSED",
                kIndent);
  OutputJsonKey(stream, kTestsuite, "timestamp",
                FormatEpochTimeInMillisAsRFC3339(result.start_timestamp()),
                kIndent);
  OutputJsonKey(stream, kTestsuite, "time",
                FormatTimeInMillisAsDuration(result.elapsed_time()), kIndent);
  OutputJsonKey(stream, kTestsuite, "classname", test_suite_name, kIndent,
                false);
  *stream << TestPropertiesAsJson(result, kIndent);

  int failures = 0;
  for (int i = 0; i < result.total_part_count(); ++i) {
    const TestPartResult& part = result.GetTestPartResult(i);
    if (part.failed()) {
      *stream << ",\n";
      if (++failures == 1) {
        *stream << kIndent << "\"" << "failures" << "\": [\n";
      }
      const std::string location =
          internal::FormatCompilerIndependentFileLocation(part.file_name(),
                                                          part.line_number());
      const std::string message = EscapeJson(location + "\n" + part.message());
      *stream << kIndent << "  {\n"
              << kIndent << "    \"failure\": \"" << message << "\",\n"
              << kIndent << "    \"type\": \"\"\n"
              << kIndent << "  }";
    }
  }

  if (failures > 0)
    *stream << "\n" << kIndent << "]";
  *stream << "\n" << Indent(8) << "}";
}